

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

int xmlXIncludeProcessFlagsData(xmlDocPtr doc,int flags,void *data)

{
  int iVar1;
  xmlNodePtr tree;
  
  if (doc != (xmlDocPtr)0x0) {
    tree = xmlDocGetRootElement(doc);
    if (tree != (xmlNodePtr)0x0) {
      iVar1 = xmlXIncludeProcessTreeFlagsData(tree,flags,data);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlXIncludeProcessFlagsData(xmlDocPtr doc, int flags, void *data) {
    xmlNodePtr tree;

    if (doc == NULL)
	return(-1);
    tree = xmlDocGetRootElement(doc);
    if (tree == NULL)
	return(-1);
    return(xmlXIncludeProcessTreeFlagsData(tree, flags, data));
}